

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::aabbTest
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          btBroadphaseAabbCallback *callback)

{
  bool bVar1;
  unsigned_short uVar2;
  Handle *pHVar3;
  long *in_RCX;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  btAxisSweep3Internal<unsigned_short> *in_RDI;
  btVector3 *unaff_retaddr;
  Handle *handle;
  unsigned_short i;
  unsigned_short axis;
  ushort local_24;
  btAxisSweep3Internal<unsigned_short> *aabbMax1;
  
  if (in_RDI->m_raycastAccelerator == (btDbvtBroadphase *)0x0) {
    aabbMax1 = in_RDI;
    for (local_24 = 1; (uint)local_24 < (uint)in_RDI->m_numHandles * 2 + 1; local_24 = local_24 + 1)
    {
      uVar2 = Edge::IsMax(in_RDI->m_pEdges[0] + local_24);
      if (uVar2 != 0) {
        pHVar3 = getHandle(in_RDI,in_RDI->m_pEdges[0][local_24].m_handle);
        bVar1 = TestAabbAgainstAabb2(unaff_retaddr,(btVector3 *)aabbMax1,in_RSI,in_RDX);
        if (bVar1) {
          (**(code **)(*in_RCX + 0x10))(in_RCX,pHVar3);
        }
      }
    }
  }
  else {
    (*(in_RDI->m_raycastAccelerator->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[7])
              (in_RDI->m_raycastAccelerator,in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::aabbTest(const btVector3& aabbMin, const btVector3& aabbMax, btBroadphaseAabbCallback& callback)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->aabbTest(aabbMin,aabbMax,callback);
	} else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i=1;i<m_numHandles*2+1;i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				Handle* handle = getHandle(m_pEdges[axis][i].m_handle);
				if (TestAabbAgainstAabb2(aabbMin,aabbMax,handle->m_aabbMin,handle->m_aabbMax))
				{
					callback.process(handle);
				}
			}
		}
	}
}